

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O1

int CfdRequestExecuteJson(void *handle,char *name,char *json_string,char **response_json_string)

{
  int iVar1;
  char *pcVar2;
  CfdException *this;
  string result;
  string command;
  allocator local_b1;
  string local_b0;
  string local_90;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  iVar1 = 1;
  if (response_json_string != (char **)0x0 && (json_string != (char *)0x0 && name != (char *)0x0)) {
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::string((string *)local_50,name,(allocator *)&local_b0);
    iVar1 = std::__cxx11::string::compare((char *)local_50);
    if (iVar1 == 0) {
      std::__cxx11::string::string((string *)&local_90,json_string,&local_b1);
      cfd::api::json::JsonMappingApi::ElementsDecodeRawTransaction(&local_b0,&local_90);
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)local_50);
      if (iVar1 == 0) {
        std::__cxx11::string::string((string *)&local_90,json_string,&local_b1);
        cfd::api::json::JsonMappingApi::DecodeRawTransaction(&local_b0,&local_90);
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)local_50);
        if (iVar1 != 0) {
          this = (CfdException *)__cxa_allocate_exception(0x30);
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b0,"unknown request name.","");
          cfd::core::CfdException::CfdException(this,kCfdIllegalArgumentError,&local_b0);
          __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException
                     );
        }
        std::__cxx11::string::string((string *)&local_90,json_string,&local_b1);
        cfd::api::json::JsonMappingApi::DecodePsbt(&local_b0,&local_90);
      }
    }
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if (local_70._M_string_length != 0) {
      pcVar2 = cfd::capi::CreateString(&local_70);
      *response_json_string = pcVar2;
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int CfdRequestExecuteJson(
    void* handle, const char* name, const char* json_string,
    char** response_json_string) {
#ifndef CFD_DISABLE_JSONAPI
  using cfd::api::json::JsonMappingApi;
  try {
    if ((name == nullptr) || (json_string == nullptr) ||
        (response_json_string == nullptr)) {
      return kCfdIllegalArgumentError;
    }

    std::string result;
    std::string command(name);
    if (command == "ElementsDecodeRawTransaction") {
#ifndef CFD_DISABLE_ELEMENTS
      result = JsonMappingApi::ElementsDecodeRawTransaction(
          std::string(json_string));
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "elements not support.");
#endif  // CFD_DISABLE_ELEMENTS
    } else if (command == "DecodeRawTransaction") {
      result = JsonMappingApi::DecodeRawTransaction(std::string(json_string));
    } else if (command == "DecodePsbt") {
      result = JsonMappingApi::DecodePsbt(std::string(json_string));
    } else {
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "unknown request name.");
    }

    if (!result.empty() && (response_json_string != nullptr)) {
      *response_json_string = cfd::capi::CreateString(result);
    }
    return kCfdSuccess;
  } catch (const CfdException& except) {
    return cfd::capi::SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    cfd::capi::SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    cfd::capi::SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
#else
  return kCfdIllegalStateError;
#endif  // CFD_DISABLE_JSONAPI
}